

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buchb.h
# Opt level: O0

void __thiscall
GF2::CritPair<45UL,_GF2::MOGrlex<45UL>_>::GetSPoly
          (CritPair<45UL,_GF2::MOGrlex<45UL>_> *this,MP<45UL,_GF2::MOGrlex<45UL>_> *spoly)

{
  bool bVar1;
  pointer this_00;
  MP<45UL,_GF2::MOGrlex<45UL>_> *this_01;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_RSI;
  long *in_RDI;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_stack_00000018;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_stack_00000020;
  MOGrlex<45UL> *in_stack_ffffffffffffffc8;
  MP<45UL,_GF2::MOGrlex<45UL>_> *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  
  this_00 = std::_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::operator->
                      ((_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *)0x1e013b);
  MP<45UL,_GF2::MOGrlex<45UL>_>::GetOrder(this_00);
  MP<45UL,_GF2::MOGrlex<45UL>_>::SetOrder(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::operator*
            ((_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *)0x1e015e);
  MP<45UL,_GF2::MOGrlex<45UL>_>::operator=
            (in_stack_ffffffffffffffd0,(MP<45UL,_GF2::MOGrlex<45UL>_> *)in_stack_ffffffffffffffc8);
  if (*in_RDI == -1) {
    std::_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::operator*
              ((_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *)0x1e018e);
    MP<45UL,_GF2::MOGrlex<45UL>_>::SPoly(in_stack_00000020,in_stack_00000018);
  }
  else {
    MP<45UL,_GF2::MOGrlex<45UL>_>::SPoly(in_RSI,in_stack_ffffffffffffffd8);
    bVar1 = MP<45UL,_GF2::MOGrlex<45UL>_>::operator!=
                      (in_RSI,SUB81(in_stack_ffffffffffffffd8 >> 0x38,0));
    if (bVar1) {
      this_01 = (MP<45UL,_GF2::MOGrlex<45UL>_> *)
                MP<45UL,_GF2::MOGrlex<45UL>_>::LM(in_stack_ffffffffffffffd0);
      std::_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::operator->
                ((_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *)0x1e01de);
      MP<45UL,_GF2::MOGrlex<45UL>_>::LM(this_01);
      bVar1 = WW<45ul>::operator==((WW<45UL> *)this_01,(WW<45UL> *)in_stack_ffffffffffffffc8);
      if (bVar1) {
        std::_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>::operator*
                  ((_List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> *)0x1e0207);
        MP<45UL,_GF2::MOGrlex<45UL>_>::operator+=
                  (this_01,(MP<45UL,_GF2::MOGrlex<45UL>_> *)in_stack_ffffffffffffffc8);
      }
    }
  }
  return;
}

Assistant:

void GetSPoly(MP<_n, _O>& spoly) const
	{
		spoly.SetOrder(iter2->GetOrder());
		spoly = *iter2;
		if (var1 == SIZE_MAX)
			// S-многочлен для пары явных многочленов
			spoly.SPoly(*iter1);
		else
		{
			// S(x_i^2-x_i, f) = f x_i mod (x_i^2-x_i)
			spoly.SPoly(var1);
			if (spoly != 0 && spoly.LM() == iter2->LM())
				spoly += *iter2;
		}
	}